

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  bool bVar5;
  uint local_38;
  int local_34;
  int result;
  int i;
  char *dest;
  char *source;
  glslopt_target languageTarget;
  bool freename;
  bool vertexShader;
  char **argv_local;
  int argc_local;
  
  if (argc < 3) {
    argv_local._4_4_ = printhelp((char *)0x0);
  }
  else {
    source._7_1_ = false;
    source._0_4_ = 0;
    dest = (char *)0x0;
    _result = (char *)0x0;
    for (local_34 = 1; local_34 < argc; local_34 = local_34 + 1) {
      if (*argv[local_34] == '-') {
        iVar2 = strcmp("-v",argv[local_34]);
        if (iVar2 == 0) {
          source._7_1_ = true;
        }
        else {
          iVar2 = strcmp("-f",argv[local_34]);
          if (iVar2 == 0) {
            source._7_1_ = false;
          }
          else {
            iVar2 = strcmp("-1",argv[local_34]);
            if (iVar2 == 0) {
              source._0_4_ = 0;
            }
            else {
              iVar2 = strcmp("-2",argv[local_34]);
              if (iVar2 == 0) {
                source._0_4_ = 1;
              }
              else {
                iVar2 = strcmp("-3",argv[local_34]);
                if (iVar2 == 0) {
                  source._0_4_ = 2;
                }
              }
            }
          }
        }
      }
      else if (dest == (char *)0x0) {
        dest = argv[local_34];
      }
      else if (_result == (char *)0x0) {
        _result = argv[local_34];
      }
    }
    if (dest == (char *)0x0) {
      argv_local._4_4_ = printhelp("Must give a source");
    }
    else {
      uVar3 = init((EVP_PKEY_CTX *)(ulong)(uint)source);
      if ((uVar3 & 1) == 0) {
        printf("Failed to initialize glslopt!\n");
        argv_local._4_4_ = 1;
      }
      else {
        bVar5 = _result == (char *)0x0;
        if (bVar5) {
          sVar4 = strlen(dest);
          _result = (char *)calloc(sVar4 + 5,1);
          sVar4 = strlen(dest);
          snprintf(_result,sVar4 + 5,"%s.out",dest);
        }
        bVar1 = compileShader(_result,dest,source._7_1_);
        local_38 = (uint)!bVar1;
        if (bVar5) {
          free(_result);
        }
        term();
        argv_local._4_4_ = local_38;
      }
    }
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[])
{
	if( argc < 3 )
		return printhelp(NULL);

	bool vertexShader = false, freename = false;
	glslopt_target languageTarget = kGlslTargetOpenGL;
	const char* source = 0;
	char* dest = 0;

	for( int i=1; i < argc; i++ )
	{
		if( argv[i][0] == '-' )
		{
			if( 0 == strcmp("-v", argv[i]) )
				vertexShader = true;
			else if( 0 == strcmp("-f", argv[i]) )
				vertexShader = false;
			else if( 0 == strcmp("-1", argv[i]) )
				languageTarget = kGlslTargetOpenGL;
			else if( 0 == strcmp("-2", argv[i]) )
				languageTarget = kGlslTargetOpenGLES20;
			else if( 0 == strcmp("-3", argv[i]) )
				languageTarget = kGlslTargetOpenGLES30;
		}
		else
		{
			if( source == 0 )
				source = argv[i];
			else if( dest == 0 )
				dest = argv[i];
		}
	}

	if( !source )
		return printhelp("Must give a source");

	if( !init(languageTarget) )
	{
		printf("Failed to initialize glslopt!\n");
		return 1;
	}

	if ( !dest ) {
		dest = (char *) calloc(strlen(source)+5, sizeof(char));
		snprintf(dest, strlen(source)+5, "%s.out", source);
		freename = true;
	}

	int result = 0;
	if( !compileShader(dest, source, vertexShader) )
		result = 1;

	if( freename ) free(dest);

	term();
	return result;
}